

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore_builder.cpp
# Opt level: O3

void * rtcThreadLocalAlloc(RTCThreadLocalAllocator localAllocator,size_t bytes,size_t align)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  FastAllocator *this;
  undefined8 *puVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *local_60;
  undefined1 local_58;
  size_t local_50;
  ThreadLocal2 *local_48;
  ThreadLocal2 *local_40;
  char local_38;
  
  this = *(FastAllocator **)localAllocator;
  puVar3 = *(undefined8 **)(localAllocator + 8);
  this_00 = (ThreadLocal2 *)*puVar3;
  local_50 = bytes;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_38 = '\x01';
    local_40 = this_00;
    embree::MutexSys::lock((MutexSys *)this_00);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (this == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = this->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = this->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    local_60 = &embree::FastAllocator::s_thread_local_allocators_lock;
    local_58 = 1;
    local_48 = this_00;
    embree::MutexSys::lock((MutexSys *)&embree::FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this->thread_local_allocators,__position,&local_48);
    }
    else {
      *__position._M_current = local_48;
      pppTVar2 = &(this->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    embree::MutexSys::unlock((MutexSys *)&embree::FastAllocator::s_thread_local_allocators_lock);
    if (local_38 == '\x01') {
      embree::MutexSys::unlock(&local_40->mutex);
    }
  }
  sVar4 = local_50;
  puVar3[5] = puVar3[5] + local_50;
  lVar7 = puVar3[2];
  uVar8 = align - lVar7 & align - 1;
  uVar5 = lVar7 + local_50 + uVar8;
  puVar3[2] = uVar5;
  if ((ulong)puVar3[3] < uVar5) {
    puVar3[2] = lVar7;
    puVar9 = (undefined8 *)puVar3[4];
    if ((undefined8 *)(local_50 * 4) < puVar9 || (long)(local_50 * 4) - (long)puVar9 == 0) {
      local_60 = puVar9;
      pvVar6 = embree::FastAllocator::malloc(this,(size_t)&local_60);
      puVar3[1] = pvVar6;
      lVar7 = (puVar3[3] - puVar3[2]) + puVar3[6];
      puVar3[6] = lVar7;
      puVar3[3] = local_60;
      uVar5 = align - 1 & align;
      puVar9 = (undefined8 *)(sVar4 + uVar5);
      puVar3[2] = puVar9;
      if (local_60 < puVar9) {
        puVar3[2] = 0;
        local_60 = (undefined8 *)puVar3[4];
        pvVar6 = embree::FastAllocator::malloc(this,(size_t)&local_60);
        puVar3[1] = pvVar6;
        lVar7 = (puVar3[3] - puVar3[2]) + puVar3[6];
        puVar3[6] = lVar7;
        puVar3[3] = local_60;
        puVar3[2] = puVar9;
        if (local_60 < puVar9) {
          puVar3[2] = 0;
          return (void *)0x0;
        }
      }
      puVar3[6] = lVar7 + uVar5;
      pvVar6 = (void *)((long)pvVar6 + uVar5);
    }
    else {
      pvVar6 = embree::FastAllocator::malloc(this,(size_t)&local_50);
    }
  }
  else {
    puVar3[6] = puVar3[6] + uVar8;
    pvVar6 = (void *)((uVar5 - local_50) + puVar3[1]);
  }
  return pvVar6;
}

Assistant:

RTC_API void* rtcThreadLocalAlloc(RTCThreadLocalAllocator localAllocator, size_t bytes, size_t align)
    {
      FastAllocator::CachedAllocator* alloc = (FastAllocator::CachedAllocator*) localAllocator;
      RTC_CATCH_BEGIN;
      RTC_TRACE(rtcThreadLocalAlloc);
      return alloc->malloc0(bytes,align);
      RTC_CATCH_END(alloc->alloc->getDevice());
      return nullptr;
    }